

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

bool __thiscall
cmTargetPropCommandBase::PopulateTargetProperies
          (cmTargetPropCommandBase *this,string *scope,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  bool bVar1;
  uint uVar2;
  bool system_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  string *scope_local;
  cmTargetPropCommandBase *this_local;
  
  bVar1 = std::operator==(scope,"PRIVATE");
  if (((bVar1) || (bVar1 = std::operator==(scope,"PUBLIC"), bVar1)) &&
     (uVar2 = (*(this->super_cmCommand)._vptr_cmCommand[10])
                        (this,this->Target,content,(ulong)prepend,(ulong)system), (uVar2 & 1) == 0))
  {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::operator==(scope,"INTERFACE");
    if ((bVar1) || (bVar1 = std::operator==(scope,"PUBLIC"), bVar1)) {
      (*(this->super_cmCommand)._vptr_cmCommand[7])
                (this,this->Target,content,(ulong)prepend,(ulong)system);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmTargetPropCommandBase::PopulateTargetProperies(
  const std::string& scope, const std::vector<std::string>& content,
  bool prepend, bool system)
{
  if (scope == "PRIVATE" || scope == "PUBLIC") {
    if (!this->HandleDirectContent(this->Target, content, prepend, system)) {
      return false;
    }
  }
  if (scope == "INTERFACE" || scope == "PUBLIC") {
    this->HandleInterfaceContent(this->Target, content, prepend, system);
  }
  return true;
}